

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

ByteData256 *
cfd::core::CryptoUtil::HmacSha256
          (ByteData256 *__return_storage_ptr__,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *key,ByteData *data)

{
  int iVar1;
  uchar *key_00;
  size_type key_len;
  uchar *bytes;
  size_type bytes_len;
  CfdException *this;
  size_type len;
  undefined8 uVar2;
  allocator_type *in_stack_fffffffffffffef0;
  string *message;
  size_type in_stack_fffffffffffffef8;
  CfdError error_code;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff00;
  allocator local_b9;
  string local_b8 [32];
  CfdSourceLocation local_98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  int local_50 [2];
  int ret;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  ByteData *data_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *key_local;
  
  output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)data;
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x3efb08);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x3efb28);
  key_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)key);
  key_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)key);
  ByteData::GetBytes(&local_68,
                     (ByteData *)
                     output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  bytes = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3efb60);
  ByteData::GetBytes(&local_80,
                     (ByteData *)
                     output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  bytes_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_80);
  message = (string *)local_38;
  this = (CfdException *)
         ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3efb96);
  len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  iVar1 = wally_hmac_sha256(key_00,key_len,bytes,bytes_len,(uchar *)this,len);
  error_code = (CfdError)(bytes_len >> 0x20);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  local_50[0] = iVar1;
  if (iVar1 != 0) {
    local_98.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_util.cpp"
                 ,0x2f);
    local_98.filename = local_98.filename + 1;
    local_98.line = 0x2ed;
    local_98.funcname = "HmacSha256";
    logger::warn<int&>(&local_98,"wally_hmac_sha256 NG[{}].",local_50);
    uVar2 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_b8,"HmacSha256 error.",&local_b9);
    CfdException::CfdException(this,error_code,message);
    __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData256::ByteData256
            (__return_storage_ptr__,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  return __return_storage_ptr__;
}

Assistant:

ByteData256 CryptoUtil::HmacSha256(
    const std::vector<uint8_t> &key, const ByteData &data) {
  std::vector<uint8_t> output(HMAC_SHA256_LEN);

  // HMAC SHA-256
  int ret = wally_hmac_sha256(
      key.data(), key.size(), data.GetBytes().data(), data.GetBytes().size(),
      output.data(), output.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_hmac_sha256 NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "HmacSha256 error.");
  }

  return ByteData256(output);
}